

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_common.cpp
# Opt level: O2

int __thiscall myutils::SharedSemaphore::timed_wait(SharedSemaphore *this,int timeout_ms)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  int iVar4;
  timespec local_40;
  timeval now;
  
  gettimeofday((timeval *)&now,(__timezone_ptr_t)0x0);
  lVar2 = (long)((timeout_ms % 1000) * 1000000) + now.tv_usec * 1000;
  local_40.tv_nsec = lVar2 % 1000000000;
  local_40.tv_sec = lVar2 / 1000000000 + timeout_ms / 1000 + now.tv_sec;
  iVar1 = sem_timedwait((sem_t *)this->m_sem,&local_40);
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    iVar4 = 0;
    if (((iVar1 != 4) && (iVar4 = 0, iVar1 != 0xb)) && (iVar1 != 0x6e)) {
      iVar4 = -1;
    }
  }
  else {
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int SharedSemaphore::timed_wait(int timeout_ms)
{
#ifdef _WIN32
    switch(WaitForSingleObject(m_hSemaphore, timeout_ms)){
    case WAIT_OBJECT_0:
        return 1;
    case WAIT_TIMEOUT:
        return 0;
    default:
        return -1;
    }
    
#elif defined(__linux__)

    struct timeval now;
    struct timespec outtime;

    gettimeofday(&now, NULL);
    memset(&outtime, 0, sizeof(outtime));
    outtime.tv_sec  = now.tv_sec + timeout_ms/1000;
    outtime.tv_nsec = now.tv_usec * 1000 + (timeout_ms%1000) * 1000000;
    outtime.tv_sec  += outtime.tv_nsec / 1000000000;
    outtime.tv_nsec %= 1000000000;
    int r = sem_timedwait(m_sem, &outtime);

    //cout << "wait " << r << "," << errno  << "," << timeout_ms << endl;
    if (r == -1) {
        switch(errno) {
        case ETIMEDOUT:    return 0;
        case EAGAIN:       return 0;
        case EINTR:       return 0;
        default:           return -1;
        }
    } else {
        return 1;
    }

#else
    struct timeval now;
    struct timespec outtime;

    pthread_mutex_lock(&m_data->mtx);

    if (m_data->count <= 0 ) {
        gettimeofday(&now, NULL);
        memset(&outtime, 0, sizeof(outtime));
        outtime.tv_sec  = now.tv_sec + timeout_ms/1000;
        outtime.tv_nsec = now.tv_usec * 1000 + (timeout_ms%1000) * 1000000;
        outtime.tv_sec  += outtime.tv_nsec / 1000000000;
        outtime.tv_nsec %= 1000000000;
        int r = pthread_cond_timedwait(&m_data->cond, &m_data->mtx, &outtime);
        int ret = 0;
        //cout << "wait " << r << "," << m_data->count << "," << timeout_ms << endl;
        if (m_data->count > 0) {
            m_data->count--;
            ret = 1;
        }
        pthread_mutex_unlock (&m_data->mtx);

        switch(r) {
        case 0:            return ret;
        case ETIMEDOUT:    return 0;
        default:           return -1;
        }

    } else {
        //cout << "wait has value " << m_data->count << endl;
        m_data->count--;
        pthread_mutex_unlock (&m_data->mtx);
        return 1;
    }
#endif
}